

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void boost::deflate::inflate_stream_test::testInflateErrors(IDecompressor *d)

{
  inflate_stream_test *piVar1;
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  error_code expected_07;
  error_code expected_08;
  error_code expected_09;
  error_code expected_10;
  error_code expected_11;
  error_code expected_12;
  error_code expected_13;
  error_code expected_14;
  error_code expected_15;
  size_t in_stack_fffffffffffffa58;
  initializer_list<unsigned_char> *local_518;
  error_category *local_510;
  undefined1 local_503;
  undefined1 local_502;
  undefined1 local_501;
  undefined1 local_500;
  undefined1 local_4ff;
  undefined1 local_4fe;
  undefined1 local_4fd;
  undefined1 local_4fc;
  undefined1 local_4fb;
  undefined1 local_4fa;
  undefined1 local_4f9;
  IDecompressor local_4f8;
  undefined8 local_4f0;
  string local_4e8;
  initializer_list<unsigned_char> *local_4c8;
  error_category *local_4c0;
  undefined1 local_4b7;
  undefined1 local_4b6;
  undefined1 local_4b5;
  undefined1 local_4b4;
  undefined1 local_4b3;
  undefined1 local_4b2;
  undefined1 local_4b1;
  IDecompressor local_4b0;
  undefined8 local_4a8;
  string local_4a0;
  initializer_list<unsigned_char> *local_480;
  error_category *local_478;
  undefined1 local_46f;
  undefined1 local_46e;
  undefined1 local_46d;
  undefined1 local_46c;
  undefined1 local_46b;
  undefined1 local_46a;
  undefined1 local_469;
  undefined1 local_468;
  undefined1 local_467;
  undefined1 local_466;
  undefined1 local_465;
  undefined1 local_464;
  undefined1 local_463;
  undefined1 local_462;
  undefined1 local_461;
  IDecompressor local_460;
  undefined8 local_458;
  string local_450;
  initializer_list<unsigned_char> *local_430;
  error_category *local_428;
  _func_int *local_41f;
  undefined8 local_417;
  undefined4 local_40f;
  undefined2 local_40b;
  undefined1 local_409;
  IDecompressor local_408;
  undefined8 local_400;
  string local_3f8;
  initializer_list<unsigned_char> *local_3d8;
  error_category *local_3d0;
  undefined1 local_3c5;
  undefined1 local_3c4;
  undefined1 local_3c3;
  undefined1 local_3c2;
  undefined1 local_3c1;
  undefined1 local_3c0;
  undefined1 local_3bf;
  undefined1 local_3be;
  undefined1 local_3bd;
  undefined1 local_3bc;
  undefined1 local_3bb;
  undefined1 local_3ba;
  undefined1 local_3b9;
  IDecompressor local_3b8;
  undefined8 local_3b0;
  string local_3a8;
  initializer_list<unsigned_char> *local_388;
  error_category *local_380;
  undefined1 local_374;
  undefined1 local_373;
  undefined1 local_372;
  undefined1 local_371;
  IDecompressor local_370;
  undefined8 local_368;
  string local_360;
  initializer_list<unsigned_char> *local_340;
  error_category *local_338;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined1 local_32c;
  undefined1 local_32b;
  undefined1 local_32a;
  undefined1 local_329;
  undefined1 local_328;
  undefined1 local_327;
  undefined1 local_326;
  undefined1 local_325;
  undefined1 local_324;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  IDecompressor local_320;
  undefined8 local_318;
  string local_310;
  initializer_list<unsigned_char> *local_2f0;
  error_category *local_2e8;
  undefined1 local_2db;
  undefined1 local_2da;
  undefined1 local_2d9;
  undefined1 local_2d8;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  undefined1 local_2d4;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  IDecompressor local_2d0;
  undefined8 local_2c8;
  string local_2c0;
  initializer_list<unsigned_char> *local_2a0;
  error_category *local_298;
  undefined1 local_28e;
  undefined1 local_28d;
  undefined1 local_28c;
  undefined1 local_28b;
  undefined1 local_28a;
  undefined1 local_289;
  undefined1 local_288;
  undefined1 local_287;
  undefined1 local_286;
  undefined1 local_285;
  undefined1 local_284;
  undefined1 local_283;
  undefined1 local_282;
  undefined1 local_281;
  IDecompressor local_280;
  undefined8 local_278;
  string local_270;
  initializer_list<unsigned_char> *local_250;
  error_category *local_248;
  undefined1 local_23e;
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  IDecompressor local_238;
  undefined8 local_230;
  string local_228;
  initializer_list<unsigned_char> *local_208;
  error_category *local_200;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4;
  undefined1 local_1f3;
  undefined1 local_1f2;
  undefined1 local_1f1;
  IDecompressor local_1f0;
  undefined8 local_1e8;
  string local_1e0;
  initializer_list<unsigned_char> *local_1c0;
  error_category *local_1b8;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  IDecompressor local_1a8;
  undefined8 local_1a0;
  string local_198;
  initializer_list<unsigned_char> *local_178;
  error_category *local_170;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  IDecompressor local_160;
  undefined8 local_158;
  string local_150;
  initializer_list<unsigned_char> *local_130;
  error_category *local_128;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  IDecompressor local_118;
  undefined8 local_110;
  string local_108;
  initializer_list<unsigned_char> *local_e8;
  error_category *local_e0;
  undefined1 local_d1;
  IDecompressor local_d0;
  undefined8 local_c8;
  string local_c0;
  initializer_list<unsigned_char> *local_a0;
  error_category *local_98;
  undefined1 local_8a;
  undefined1 local_89;
  IDecompressor local_88;
  undefined8 local_80;
  string local_78;
  initializer_list<unsigned_char> *local_58;
  error_category *local_50;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  IDecompressor local_40;
  undefined8 local_38;
  string local_30;
  inflate_stream_test *local_10;
  IDecompressor *d_local;
  
  local_45 = 0;
  local_44 = 0;
  local_43 = 0;
  local_42 = 0;
  local_41 = 0;
  local_40._vptr_IDecompressor = (_func_int **)&local_45;
  local_38 = 5;
  local_10 = (inflate_stream_test *)d;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_58,invalid_stored_length,(type *)0x0);
  expected.cat_ = (error_category *)0x0;
  expected._0_8_ = local_50;
  check_abi_cxx11_(&local_30,(inflate_stream_test *)d,&local_40,local_58,expected,0xf,
                   0xffffffffffffffff,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_30);
  piVar1 = local_10;
  local_8a = 3;
  local_89 = 0;
  local_88._vptr_IDecompressor = (_func_int **)&local_8a;
  local_80 = 2;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_a0,end_of_stream,(type *)0x0);
  expected_00.cat_ = (error_category *)0x0;
  expected_00._0_8_ = local_98;
  check_abi_cxx11_(&local_78,piVar1,&local_88,local_a0,expected_00,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_78);
  piVar1 = local_10;
  local_d1 = 6;
  local_d0._vptr_IDecompressor = (_func_int **)&local_d1;
  local_c8 = 1;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_e8,invalid_block_type,(type *)0x0);
  expected_01.cat_ = (error_category *)0x0;
  expected_01._0_8_ = local_e0;
  check_abi_cxx11_(&local_c0,piVar1,&local_d0,local_e8,expected_01,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_c0);
  piVar1 = local_10;
  local_11b = 0xfc;
  local_11a = 0;
  local_119 = 0;
  local_118._vptr_IDecompressor = (_func_int **)&local_11b;
  local_110 = 3;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_130,too_many_symbols,(type *)0x0);
  expected_02.cat_ = (error_category *)0x0;
  expected_02._0_8_ = local_128;
  check_abi_cxx11_(&local_108,piVar1,&local_118,local_130,expected_02,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_108);
  piVar1 = local_10;
  local_164 = 4;
  local_163 = 0;
  local_162 = 0xfe;
  local_161 = 0xff;
  local_160._vptr_IDecompressor = (_func_int **)&local_164;
  local_158 = 4;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_178,incomplete_length_set,(type *)0x0);
  expected_03.cat_ = (error_category *)0x0;
  expected_03._0_8_ = local_170;
  check_abi_cxx11_(&local_150,piVar1,&local_160,local_178,expected_03,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_150);
  piVar1 = local_10;
  local_1ad = 4;
  local_1ac = 0;
  local_1ab = 0x24;
  local_1aa = 0x49;
  local_1a9 = 0;
  local_1a8._vptr_IDecompressor = (_func_int **)&local_1ad;
  local_1a0 = 5;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_1c0,invalid_bit_length_repeat,(type *)0x0);
  expected_04.cat_ = (error_category *)0x0;
  expected_04._0_8_ = local_1b8;
  check_abi_cxx11_(&local_198,piVar1,&local_1a8,local_1c0,expected_04,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_198);
  piVar1 = local_10;
  local_1f6 = 4;
  local_1f5 = 0;
  local_1f4 = 0x24;
  local_1f3 = 0xe9;
  local_1f2 = 0xff;
  local_1f1 = 0xff;
  local_1f0._vptr_IDecompressor = (_func_int **)&local_1f6;
  local_1e8 = 6;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_208,invalid_bit_length_repeat,(type *)0x0);
  expected_05.cat_ = (error_category *)0x0;
  expected_05._0_8_ = local_200;
  check_abi_cxx11_(&local_1e0,piVar1,&local_1f0,local_208,expected_05,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_1e0);
  piVar1 = local_10;
  local_23e = 4;
  local_23d = 0;
  local_23c = 0x24;
  local_23b = 0xe9;
  local_23a = 0xff;
  local_239 = 0x6d;
  local_238._vptr_IDecompressor = (_func_int **)&local_23e;
  local_230 = 6;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_250,missing_eob,(type *)0x0);
  expected_06.cat_ = (error_category *)0x0;
  expected_06._0_8_ = local_248;
  check_abi_cxx11_(&local_228,piVar1,&local_238,local_250,expected_06,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_228);
  piVar1 = local_10;
  local_28e = 4;
  local_28d = 0x80;
  local_28c = 0x49;
  local_28b = 0x92;
  local_28a = 0x24;
  local_289 = 0x49;
  local_288 = 0x92;
  local_287 = 0x24;
  local_286 = 0x71;
  local_285 = 0xff;
  local_284 = 0xff;
  local_283 = 0x93;
  local_282 = 0x11;
  local_281 = 0;
  local_280._vptr_IDecompressor = (_func_int **)&local_28e;
  local_278 = 0xe;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2a0,over_subscribed_length,(type *)0x0);
  expected_07.cat_ = (error_category *)0x0;
  expected_07._0_8_ = local_298;
  check_abi_cxx11_(&local_270,piVar1,&local_280,local_2a0,expected_07,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_270);
  piVar1 = local_10;
  local_2db = 4;
  local_2da = 0x80;
  local_2d9 = 0x49;
  local_2d8 = 0x92;
  local_2d7 = 0x24;
  local_2d6 = 0xf;
  local_2d5 = 0xb4;
  local_2d4 = 0xff;
  local_2d3 = 0xff;
  local_2d2 = 0xc3;
  local_2d1 = 0x84;
  local_2d0._vptr_IDecompressor = (_func_int **)&local_2db;
  local_2c8 = 0xb;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2f0,incomplete_length_set,(type *)0x0);
  expected_08.cat_ = (error_category *)0x0;
  expected_08._0_8_ = local_2e8;
  check_abi_cxx11_(&local_2c0,piVar1,&local_2d0,local_2f0,expected_08,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_2c0);
  piVar1 = local_10;
  local_32e = 4;
  local_32d = 0xc0;
  local_32c = 0x81;
  local_32b = 8;
  local_32a = 0;
  local_329 = 0;
  local_328 = 0;
  local_327 = 0;
  local_326 = 0x20;
  local_325 = 0x7f;
  local_324 = 0xeb;
  local_323 = 0xb;
  local_322 = 0;
  local_321 = 0;
  local_320._vptr_IDecompressor = (_func_int **)&local_32e;
  local_318 = 0xe;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_340,invalid_literal_length,(type *)0x0);
  expected_09.cat_ = (error_category *)0x0;
  expected_09._0_8_ = local_338;
  check_abi_cxx11_(&local_310,piVar1,&local_320,local_340,expected_09,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_310);
  piVar1 = local_10;
  local_374 = 2;
  local_373 = 0x7e;
  local_372 = 0xff;
  local_371 = 0xff;
  local_370._vptr_IDecompressor = (_func_int **)&local_374;
  local_368 = 4;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_388,invalid_distance_code,(type *)0x0);
  expected_10.cat_ = (error_category *)0x0;
  expected_10._0_8_ = local_380;
  check_abi_cxx11_(&local_360,piVar1,&local_370,local_388,expected_10,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_360);
  piVar1 = local_10;
  local_3c5 = 0xc;
  local_3c4 = 0xc0;
  local_3c3 = 0x81;
  local_3c2 = 0;
  local_3c1 = 0;
  local_3c0 = 0;
  local_3bf = 0;
  local_3be = 0;
  local_3bd = 0x90;
  local_3bc = 0xff;
  local_3bb = 0x6b;
  local_3ba = 4;
  local_3b9 = 0;
  local_3b8._vptr_IDecompressor = (_func_int **)&local_3c5;
  local_3b0 = 0xd;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_3d8,invalid_distance,(type *)0x0);
  expected_11.cat_ = (error_category *)0x0;
  expected_11._0_8_ = local_3d0;
  check_abi_cxx11_(&local_3a8,piVar1,&local_3b8,local_3d8,expected_11,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_3a8);
  piVar1 = local_10;
  local_41f = (_func_int *)0x2cb2cb249181e005;
  local_417 = 0x56479a8b2e0fe249;
  local_40f = 0xecfefb9f;
  local_40b = 0xffd2;
  local_409 = 0x1f;
  local_408._vptr_IDecompressor = &local_41f;
  local_400 = 0x17;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_430,end_of_stream,(type *)0x0);
  expected_12.cat_ = (error_category *)0x0;
  expected_12._0_8_ = local_428;
  check_abi_cxx11_(&local_3f8,piVar1,&local_408,local_430,expected_12,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_3f8);
  piVar1 = local_10;
  local_46f = 0xed;
  local_46e = 0xc0;
  local_46d = 1;
  local_46c = 1;
  local_46b = 0;
  local_46a = 0;
  local_469 = 0;
  local_468 = 0x40;
  local_467 = 0x20;
  local_466 = 0xff;
  local_465 = 0x57;
  local_464 = 0x1b;
  local_463 = 0x42;
  local_462 = 0x2c;
  local_461 = 0x4f;
  local_460._vptr_IDecompressor = (_func_int **)&local_46f;
  local_458 = 0xf;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_480,end_of_stream,(type *)0x0);
  expected_13.cat_ = (error_category *)0x0;
  expected_13._0_8_ = local_478;
  check_abi_cxx11_(&local_450,piVar1,&local_460,local_480,expected_13,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_450);
  piVar1 = local_10;
  local_4b7 = 2;
  local_4b6 = 8;
  local_4b5 = 0x20;
  local_4b4 = 0x80;
  local_4b3 = 0;
  local_4b2 = 3;
  local_4b1 = 0;
  local_4b0._vptr_IDecompressor = (_func_int **)&local_4b7;
  local_4a8 = 7;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_4c8,end_of_stream,(type *)0x0);
  expected_14.cat_ = (error_category *)0x0;
  expected_14._0_8_ = local_4c0;
  check_abi_cxx11_(&local_4a0,piVar1,&local_4b0,local_4c8,expected_14,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_4a0);
  piVar1 = local_10;
  local_503 = 0x78;
  local_502 = 0x9c;
  local_501 = 3;
  local_500 = 0;
  local_4ff = 0;
  local_4fe = 0;
  local_4fd = 0;
  local_4fc = 1;
  local_4fb = 0x78;
  local_4fa = 0x9c;
  local_4f9 = 0xff;
  local_4f8._vptr_IDecompressor = (_func_int **)&local_503;
  local_4f0 = 0xb;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_518,invalid_stored_length,(type *)0x0);
  expected_15.cat_ = (error_category *)0x0;
  expected_15._0_8_ = local_510;
  check_abi_cxx11_(&local_4e8,piVar1,&local_4f8,local_518,expected_15,0xf,0xffffffffffffffff,
                   in_stack_fffffffffffffa58);
  std::__cxx11::string::~string((string *)&local_4e8);
  return;
}

Assistant:

static
    void testInflateErrors(IDecompressor& d)
    {
        check(d, {0x00, 0x00, 0x00, 0x00, 0x00},
            error::invalid_stored_length);
        check(d, {0x03, 0x00},
            error::end_of_stream);
        check(d, {0x06},
            error::invalid_block_type);
        check(d, {0xfc, 0x00, 0x00},
            error::too_many_symbols);
        check(d, {0x04, 0x00, 0xfe, 0xff},
            error::incomplete_length_set);
        check(d, {0x04, 0x00, 0x24, 0x49, 0x00},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0xff},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0x6d},
            error::missing_eob);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x49, 0x92, 0x24,
               0x71, 0xff, 0xff, 0x93, 0x11, 0x00},
            error::over_subscribed_length);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x0f, 0xb4, 0xff,
               0xff, 0xc3, 0x84},
            error::incomplete_length_set);
        check(d, {0x04, 0xc0, 0x81, 0x08, 0x00, 0x00, 0x00, 0x00,
               0x20, 0x7f, 0xeb, 0x0b, 0x00, 0x00},
            error::invalid_literal_length);
        check(d, {0x02, 0x7e, 0xff, 0xff},
            error::invalid_distance_code);
        check(d, {0x0c, 0xc0, 0x81, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x90, 0xff, 0x6b, 0x04, 0x00},
            error::invalid_distance);
        check(d, {0x05,0xe0, 0x81, 0x91, 0x24, 0xcb, 0xb2, 0x2c,
               0x49, 0xe2, 0x0f, 0x2e, 0x8b, 0x9a, 0x47, 0x56,
               0x9f, 0xfb, 0xfe, 0xec, 0xd2, 0xff, 0x1f},
            error::end_of_stream);
        check(d, {0xed, 0xc0, 0x01, 0x01, 0x00, 0x00, 0x00, 0x40,
               0x20, 0xff, 0x57, 0x1b, 0x42, 0x2c, 0x4f},
            error::end_of_stream);
        check(d, {0x02, 0x08, 0x20, 0x80, 0x00, 0x03, 0x00},
            error::end_of_stream);
        check(d, {0x78, 0x9c, 0x03, 0x00, 0x00, 0x00, 0x00, 0x01, 0x78, 0x9c, 0xff},
            error::invalid_stored_length);
    }